

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_54::YieldPromiseNode::get(YieldPromiseNode *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::_::Void> local_168;
  
  local_168.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_168.value.ptr.isSet = true;
  _::ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_168);
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_168);
  return;
}

Assistant:

void get(_::ExceptionOrValue& output) noexcept override {
    output.as<_::Void>() = _::Void();
  }